

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceputils.c
# Opt level: O2

char * key_fingerprint(X509_REQ *req)

{
  char *pcVar1;
  BIO_METHOD *type;
  BIO *bp;
  EVP_PKEY *pkey;
  long lVar2;
  byte *md_00;
  uchar *data;
  uchar md [16];
  MD5_CTX ctx;
  
  pcVar1 = (char *)malloc(0x21);
  type = BIO_s_mem();
  bp = BIO_new(type);
  pkey = X509_REQ_get_pubkey((X509_REQ *)req);
  i2d_PUBKEY_bio(bp,pkey);
  lVar2 = BIO_ctrl(bp,3,0,&data);
  MD5_Init((MD5_CTX *)&ctx);
  MD5_Update((MD5_CTX *)&ctx,data,(long)(int)lVar2);
  md_00 = md;
  MD5_Final(md_00,(MD5_CTX *)&ctx);
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 2) {
    sprintf(pcVar1 + lVar2,"%02X",(ulong)*md_00);
    md_00 = md_00 + 1;
  }
  pcVar1[0x20] = '\0';
  return pcVar1;
}

Assistant:

char* key_fingerprint(X509_REQ *req) {
    char           *ret, *str;
    unsigned char  *data, md[MD5_DIGEST_LENGTH];
    int            c, len;
    BIO            *bio;
    MD5_CTX        ctx;

    // Assign space for ASCII presentation of the digest
    str = (unsigned char *)malloc(2 * MD5_DIGEST_LENGTH + 1);
    ret = str;

    // Create new memory bio for reading the public key
    bio = BIO_new(BIO_s_mem());
    i2d_PUBKEY_bio(bio, X509_REQ_get_pubkey(req));
    len = BIO_get_mem_data(bio, &data);

    // Calculate MD5 hash:
    MD5_Init(&ctx);
    MD5_Update(&ctx, data, len);
    MD5_Final(md, &ctx);

    // Copy as ASCII string and return:
    for (c = 0; c < MD5_DIGEST_LENGTH; c++, str += 2) {
        sprintf((char *)str, "%02X", md[c]);
    }

    *(str) = '\0';
    return(ret);
}